

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchPrintNtkStats.cpp
# Opt level: O3

void Bmatch_PrintMatchPairs
               (vector<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                *a)

{
  int iVar1;
  pointer ppVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar4 = (uint)((ulong)((long)(a->
                               super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(a->
                              super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      pcVar5 = Abc_ObjName(((a->
                            super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar9].first)->thisObj);
      printf("%7s is equivalent to : \n",pcVar5);
      ppVar2 = (a->
               super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&ppVar2[uVar9].second.
                                            super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>
                                            ._M_impl + 8) -
                            *(long *)&ppVar2[uVar9].second.
                                      super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                      _M_impl) >> 3);
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          lVar3 = *(long *)(*(long *)&(a->
                                      super__Vector_base<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>,_std::allocator<std::pair<suppWrap_*,_std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar9].second.
                                      super__Vector_base<suppWrap_*,_std::allocator<suppWrap_*>_>.
                                      _M_impl + uVar8 * 8);
          iVar1 = *(int *)(lVar3 + 0x28);
          pcVar6 = Abc_ObjName(*(Abc_Obj_t **)(lVar3 + 8));
          pcVar5 = "%9s \n";
          if (iVar1 == 2) {
            pcVar5 = "-%8s \n";
          }
          printf(pcVar5,pcVar6);
          uVar8 = uVar8 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar8);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar4 & 0x7fffffff));
  }
  return;
}

Assistant:

void Bmatch_PrintMatchPairs ( vector< pair < suppWrap *, vector< suppWrap * > > > & a )
{
    for( int i = 0, n = a.size(); i < n; ++i ) {
        printf("%7s is equivalent to : \n", Abc_ObjName( a[i].first->thisObj ) );
        for( int j = 0, m = a[i].second.size(); j < m; ++j ) {
        	if( a[i].second[j]->status == NEGATIVE )
            	printf( "-%8s \n", Abc_ObjName( a[i].second[j]->thisObj ));
            else
            	printf( "%9s \n", Abc_ObjName( a[i].second[j]->thisObj ));
        }
    }
}